

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformfontdatabase.cpp
# Opt level: O2

QSupportedWritingSystems __thiscall
QPlatformFontDatabase::writingSystemsFromOS2Table
          (QPlatformFontDatabase *this,char *os2Table,size_t length)

{
  uint uVar1;
  short sVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint local_30;
  uint local_2c;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (length < 0x56) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QSupportedWritingSystems::QSupportedWritingSystems((QSupportedWritingSystems *)this);
      return (QSupportedWritingSystems)(QWritingSystemsPrivate *)this;
    }
  }
  else {
    auVar12 = *(undefined1 (*) [16])(os2Table + 0x2a);
    auVar14[1] = 0;
    auVar14[0] = auVar12[8];
    auVar14[2] = auVar12[9];
    auVar14[3] = 0;
    auVar14[4] = auVar12[10];
    auVar14[5] = 0;
    auVar14[6] = auVar12[0xb];
    auVar14[7] = 0;
    auVar14[8] = auVar12[0xc];
    auVar14[9] = 0;
    auVar14[10] = auVar12[0xd];
    auVar14[0xb] = 0;
    auVar14[0xc] = auVar12[0xe];
    auVar14[0xd] = 0;
    auVar14[0xe] = auVar12[0xf];
    auVar14[0xf] = 0;
    auVar13 = pshuflw(auVar14,auVar14,0x1b);
    auVar14 = pshufhw(auVar13,auVar13,0x1b);
    auVar3[0xd] = 0;
    auVar3._0_13_ = auVar12._0_13_;
    auVar3[0xe] = auVar12[7];
    auVar4[0xc] = auVar12[6];
    auVar4._0_12_ = auVar12._0_12_;
    auVar4._13_2_ = auVar3._13_2_;
    auVar5[0xb] = 0;
    auVar5._0_11_ = auVar12._0_11_;
    auVar5._12_3_ = auVar4._12_3_;
    auVar6[10] = auVar12[5];
    auVar6._0_10_ = auVar12._0_10_;
    auVar6._11_4_ = auVar5._11_4_;
    auVar7[9] = 0;
    auVar7._0_9_ = auVar12._0_9_;
    auVar7._10_5_ = auVar6._10_5_;
    auVar8[8] = auVar12[4];
    auVar8._0_8_ = auVar12._0_8_;
    auVar8._9_6_ = auVar7._9_6_;
    auVar9._7_8_ = 0;
    auVar9._0_7_ = auVar8._8_7_;
    auVar10._1_8_ = SUB158(auVar9 << 0x40,7);
    auVar10[0] = auVar12[3];
    auVar10._9_6_ = 0;
    auVar11._1_10_ = SUB1510(auVar10 << 0x30,5);
    auVar11[0] = auVar12[2];
    auVar11._11_4_ = 0;
    auVar13._3_12_ = SUB1512(auVar11 << 0x20,3);
    auVar13[2] = auVar12[1];
    auVar13[0] = auVar12[0];
    auVar13[1] = 0;
    auVar13[0xf] = 0;
    auVar12 = pshuflw(auVar13,auVar13,0x1b);
    auVar12 = pshufhw(auVar12,auVar12,0x1b);
    sVar2 = auVar12._0_2_;
    local_28 = (0 < sVar2) * (sVar2 < 0x100) * auVar12[0] - (0xff < sVar2);
    sVar2 = auVar12._2_2_;
    cStack_27 = (0 < sVar2) * (sVar2 < 0x100) * auVar12[2] - (0xff < sVar2);
    sVar2 = auVar12._4_2_;
    cStack_26 = (0 < sVar2) * (sVar2 < 0x100) * auVar12[4] - (0xff < sVar2);
    sVar2 = auVar12._6_2_;
    cStack_25 = (0 < sVar2) * (sVar2 < 0x100) * auVar12[6] - (0xff < sVar2);
    sVar2 = auVar12._8_2_;
    cStack_24 = (0 < sVar2) * (sVar2 < 0x100) * auVar12[8] - (0xff < sVar2);
    sVar2 = auVar12._10_2_;
    cStack_23 = (0 < sVar2) * (sVar2 < 0x100) * auVar12[10] - (0xff < sVar2);
    sVar2 = auVar12._12_2_;
    cStack_22 = (0 < sVar2) * (sVar2 < 0x100) * auVar12[0xc] - (0xff < sVar2);
    sVar2 = auVar12._14_2_;
    cStack_21 = (0 < sVar2) * (sVar2 < 0x100) * auVar12[0xe] - (0xff < sVar2);
    sVar2 = auVar14._0_2_;
    cStack_20 = (0 < sVar2) * (sVar2 < 0x100) * auVar14[0] - (0xff < sVar2);
    sVar2 = auVar14._2_2_;
    cStack_1f = (0 < sVar2) * (sVar2 < 0x100) * auVar14[2] - (0xff < sVar2);
    sVar2 = auVar14._4_2_;
    cStack_1e = (0 < sVar2) * (sVar2 < 0x100) * auVar14[4] - (0xff < sVar2);
    sVar2 = auVar14._6_2_;
    cStack_1d = (0 < sVar2) * (sVar2 < 0x100) * auVar14[6] - (0xff < sVar2);
    sVar2 = auVar14._8_2_;
    cStack_1c = (0 < sVar2) * (sVar2 < 0x100) * auVar14[8] - (0xff < sVar2);
    sVar2 = auVar14._10_2_;
    cStack_1b = (0 < sVar2) * (sVar2 < 0x100) * auVar14[10] - (0xff < sVar2);
    sVar2 = auVar14._12_2_;
    cStack_1a = (0 < sVar2) * (sVar2 < 0x100) * auVar14[0xc] - (0xff < sVar2);
    sVar2 = auVar14._14_2_;
    cStack_19 = (0 < sVar2) * (sVar2 < 0x100) * auVar14[0xe] - (0xff < sVar2);
    uVar1 = *(uint *)(os2Table + 0x4e);
    local_30 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)(os2Table + 0x52);
    local_2c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    writingSystemsFromTrueTypeBits(this,(quint32 *)&local_28,&local_30);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return (QSupportedWritingSystems)(QWritingSystemsPrivate *)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QSupportedWritingSystems QPlatformFontDatabase::writingSystemsFromOS2Table(const char *os2Table, size_t length)
{
    if (length >= 86)  {
        quint32 unicodeRange[4] = {
            qFromBigEndian<quint32>(os2Table + 42),
            qFromBigEndian<quint32>(os2Table + 46),
            qFromBigEndian<quint32>(os2Table + 50),
            qFromBigEndian<quint32>(os2Table + 54)
        };
        quint32 codePageRange[2] = {
            qFromBigEndian<quint32>(os2Table + 78),
            qFromBigEndian<quint32>(os2Table + 82)
        };

        return writingSystemsFromTrueTypeBits(unicodeRange, codePageRange);
    }

    return QSupportedWritingSystems();
}